

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

bool __thiscall
llvm::cl::parser<bool>::parse
          (parser<bool> *this,Option *O,StringRef ArgName,StringRef Arg,bool *Value)

{
  Option *this_00;
  raw_ostream *Errs;
  bool bVar1;
  bool bVar2;
  bool local_601;
  StringRef local_5f0;
  Twine local_5e0;
  Twine local_5c8;
  Twine local_5b0;
  char *local_598;
  parser<bool> *local_588;
  char *local_580;
  char *local_578;
  parser<bool> *local_568;
  char *local_560;
  char *local_558;
  parser<bool> *local_548;
  char *local_540;
  char *local_538;
  parser<bool> *local_528;
  char *local_520;
  char *local_518;
  parser<bool> *local_508;
  char *local_500;
  char *local_4f8;
  parser<bool> *local_4e8;
  char *local_4e0;
  char *local_4d8;
  parser<bool> *local_4c8;
  char *local_4c0;
  char *local_4b8;
  parser<bool> *local_4a8;
  char *local_4a0;
  char *local_498;
  parser<bool> *local_488;
  char *local_480;
  Option *local_478;
  Option *O_local;
  parser<bool> *this_local;
  StringRef Arg_local;
  StringRef ArgName_local;
  parser<bool> *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  parser<bool> *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  parser<bool> *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  parser<bool> *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  parser<bool> *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  parser<bool> *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  parser<bool> *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  parser<bool> *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  parser<bool> *local_210;
  char *local_208;
  parser<bool> **local_200;
  char *local_1f8;
  char *local_1f0;
  parser<bool> **local_1e8;
  char *local_1e0;
  char *local_1d8;
  parser<bool> **local_1d0;
  char *local_1c8;
  char *local_1c0;
  parser<bool> **local_1b8;
  char *local_1b0;
  char *local_1a8;
  parser<bool> **local_1a0;
  char *local_198;
  char *local_190;
  parser<bool> **local_188;
  char *local_180;
  char *local_178;
  parser<bool> **local_170;
  char *local_168;
  char *local_160;
  parser<bool> **local_158;
  char *local_150;
  char *local_148;
  parser<bool> **local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  parser<bool> *local_118;
  int local_10c;
  char *local_108;
  char *local_100;
  parser<bool> *local_f8;
  int local_ec;
  char *local_e8;
  char *local_e0;
  parser<bool> *local_d8;
  int local_cc;
  char *local_c8;
  char *local_c0;
  parser<bool> *local_b8;
  int local_ac;
  char *local_a8;
  char *local_a0;
  parser<bool> *local_98;
  int local_8c;
  char *local_88;
  char *local_80;
  parser<bool> *local_78;
  int local_6c;
  char *local_68;
  char *local_60;
  parser<bool> *local_58;
  int local_4c;
  char *local_48;
  char *local_40;
  parser<bool> *local_38;
  int local_2c;
  char *local_28;
  char *local_20;
  parser<bool> *local_18;
  int local_c;
  
  local_480 = (char *)Arg.Length;
  local_488 = (parser<bool> *)Arg.Data;
  Arg_local.Length = (size_t)ArgName.Data;
  local_498 = "";
  local_478 = O;
  O_local = (Option *)this;
  this_local = local_488;
  Arg_local.Data = local_480;
  local_228 = (char *)strlen("");
  local_210 = local_488;
  local_208 = local_480;
  local_220 = local_498;
  local_230 = local_498;
  local_1f8 = local_498;
  local_200 = &local_210;
  local_601 = false;
  local_218 = local_228;
  local_1f0 = local_228;
  if (local_480 == local_228) {
    local_18 = local_488;
    local_20 = local_498;
    local_28 = local_228;
    if (local_228 == (char *)0x0) {
      local_c = 0;
    }
    else {
      local_c = memcmp(local_488,local_498,(size_t)local_228);
    }
    local_601 = local_c == 0;
  }
  bVar2 = true;
  if (!local_601) {
    local_4a8 = this_local;
    local_4a0 = Arg_local.Data;
    local_4b8 = "true";
    local_258 = (char *)strlen("true");
    local_240 = local_4a8;
    local_238 = local_4a0;
    local_250 = local_4b8;
    local_260 = local_4b8;
    local_1e0 = local_4b8;
    local_1e8 = &local_240;
    bVar1 = false;
    local_248 = local_258;
    local_1d8 = local_258;
    if (local_4a0 == local_258) {
      local_38 = local_4a8;
      local_40 = local_4b8;
      local_48 = local_258;
      if (local_258 == (char *)0x0) {
        local_2c = 0;
      }
      else {
        local_2c = memcmp(local_4a8,local_4b8,(size_t)local_258);
      }
      bVar1 = local_2c == 0;
    }
    bVar2 = true;
    if (!bVar1) {
      local_4c8 = this_local;
      local_4c0 = Arg_local.Data;
      local_4d8 = "TRUE";
      local_288 = (char *)strlen("TRUE");
      local_270 = local_4c8;
      local_268 = local_4c0;
      local_280 = local_4d8;
      local_290 = local_4d8;
      local_1c8 = local_4d8;
      local_1d0 = &local_270;
      bVar1 = false;
      local_278 = local_288;
      local_1c0 = local_288;
      if (local_4c0 == local_288) {
        local_58 = local_4c8;
        local_60 = local_4d8;
        local_68 = local_288;
        if (local_288 == (char *)0x0) {
          local_4c = 0;
        }
        else {
          local_4c = memcmp(local_4c8,local_4d8,(size_t)local_288);
        }
        bVar1 = local_4c == 0;
      }
      bVar2 = true;
      if (!bVar1) {
        local_4e8 = this_local;
        local_4e0 = Arg_local.Data;
        local_4f8 = "True";
        local_2b8 = (char *)strlen("True");
        local_2a0 = local_4e8;
        local_298 = local_4e0;
        local_2b0 = local_4f8;
        local_2c0 = local_4f8;
        local_1b0 = local_4f8;
        local_1b8 = &local_2a0;
        bVar1 = false;
        local_2a8 = local_2b8;
        local_1a8 = local_2b8;
        if (local_4e0 == local_2b8) {
          local_78 = local_4e8;
          local_80 = local_4f8;
          local_88 = local_2b8;
          if (local_2b8 == (char *)0x0) {
            local_6c = 0;
          }
          else {
            local_6c = memcmp(local_4e8,local_4f8,(size_t)local_2b8);
          }
          bVar1 = local_6c == 0;
        }
        bVar2 = true;
        if (!bVar1) {
          local_508 = this_local;
          local_500 = Arg_local.Data;
          local_518 = "1";
          local_2e8 = (char *)strlen("1");
          local_2d0 = local_508;
          local_2c8 = local_500;
          local_2e0 = local_518;
          local_2f0 = local_518;
          local_198 = local_518;
          local_1a0 = &local_2d0;
          bVar2 = false;
          local_2d8 = local_2e8;
          local_190 = local_2e8;
          if (local_500 == local_2e8) {
            local_98 = local_508;
            local_a0 = local_518;
            local_a8 = local_2e8;
            if (local_2e8 == (char *)0x0) {
              local_8c = 0;
            }
            else {
              local_8c = memcmp(local_508,local_518,(size_t)local_2e8);
            }
            bVar2 = local_8c == 0;
          }
        }
      }
    }
  }
  if (bVar2) {
    *Value = true;
    ArgName_local.Length._7_1_ = false;
  }
  else {
    local_528 = this_local;
    local_520 = Arg_local.Data;
    local_538 = "false";
    local_318 = (char *)strlen("false");
    local_300 = local_528;
    local_2f8 = local_520;
    local_310 = local_538;
    local_320 = local_538;
    local_180 = local_538;
    local_188 = &local_300;
    bVar2 = false;
    local_308 = local_318;
    local_178 = local_318;
    if (local_520 == local_318) {
      local_b8 = local_528;
      local_c0 = local_538;
      local_c8 = local_318;
      if (local_318 == (char *)0x0) {
        local_ac = 0;
      }
      else {
        local_ac = memcmp(local_528,local_538,(size_t)local_318);
      }
      bVar2 = local_ac == 0;
    }
    bVar1 = true;
    if (!bVar2) {
      local_548 = this_local;
      local_540 = Arg_local.Data;
      local_558 = "FALSE";
      local_348 = (char *)strlen("FALSE");
      local_330 = local_548;
      local_328 = local_540;
      local_340 = local_558;
      local_350 = local_558;
      local_168 = local_558;
      local_170 = &local_330;
      bVar2 = false;
      local_338 = local_348;
      local_160 = local_348;
      if (local_540 == local_348) {
        local_d8 = local_548;
        local_e0 = local_558;
        local_e8 = local_348;
        if (local_348 == (char *)0x0) {
          local_cc = 0;
        }
        else {
          local_cc = memcmp(local_548,local_558,(size_t)local_348);
        }
        bVar2 = local_cc == 0;
      }
      bVar1 = true;
      if (!bVar2) {
        local_568 = this_local;
        local_560 = Arg_local.Data;
        local_578 = "False";
        local_378 = (char *)strlen("False");
        local_360 = local_568;
        local_358 = local_560;
        local_370 = local_578;
        local_380 = local_578;
        local_150 = local_578;
        local_158 = &local_360;
        bVar2 = false;
        local_368 = local_378;
        local_148 = local_378;
        if (local_560 == local_378) {
          local_f8 = local_568;
          local_100 = local_578;
          local_108 = local_378;
          if (local_378 == (char *)0x0) {
            local_ec = 0;
          }
          else {
            local_ec = memcmp(local_568,local_578,(size_t)local_378);
          }
          bVar2 = local_ec == 0;
        }
        bVar1 = true;
        if (!bVar2) {
          local_588 = this_local;
          local_580 = Arg_local.Data;
          local_598 = "0";
          local_130 = (char *)strlen("0");
          local_390 = local_588;
          local_388 = local_580;
          local_138 = local_598;
          local_140 = &local_390;
          bVar1 = false;
          if (local_580 == local_130) {
            local_118 = local_588;
            local_120 = local_598;
            local_128 = local_130;
            if (local_130 == (char *)0x0) {
              local_10c = 0;
            }
            else {
              local_10c = memcmp(local_588,local_598,(size_t)local_130);
            }
            bVar1 = local_10c == 0;
          }
        }
      }
    }
    this_00 = local_478;
    if (bVar1) {
      *Value = false;
      ArgName_local.Length._7_1_ = false;
    }
    else {
      llvm::operator+(&local_5c8,"\'",(StringRef *)&this_local);
      Twine::Twine(&local_5e0,"\' is invalid value for boolean argument! Try 0 or 1");
      llvm::operator+(&local_5b0,&local_5c8,&local_5e0);
      memset(&local_5f0,0,0x10);
      StringRef::StringRef(&local_5f0);
      Errs = errs();
      ArgName_local.Length._7_1_ = Option::error(this_00,&local_5b0,local_5f0,Errs);
    }
  }
  return ArgName_local.Length._7_1_;
}

Assistant:

bool parser<bool>::parse(Option &O, StringRef ArgName, StringRef Arg,
                         bool &Value) {
  if (Arg == "" || Arg == "true" || Arg == "TRUE" || Arg == "True" ||
      Arg == "1") {
    Value = true;
    return false;
  }

  if (Arg == "false" || Arg == "FALSE" || Arg == "False" || Arg == "0") {
    Value = false;
    return false;
  }
  return O.error("'" + Arg +
                 "' is invalid value for boolean argument! Try 0 or 1");
}